

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O0

long testReadFromQuoteRequest(int count)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uint local_920;
  int k;
  int end;
  NoRelatedSym noRelatedSym;
  OrdType ordType;
  Currency currency;
  OrderQty orderQty;
  Side side;
  StrikePrice strikePrice;
  PutOrCall putOrCall;
  MaturityMonthYear maturityMonthYear;
  Symbol symbol;
  QuoteReqID quoteReqID;
  int j;
  long start;
  allocator<char> local_539;
  CURRENCY local_538;
  Currency local_518;
  QTY local_4c0;
  OrderQty local_4b8;
  Side local_460;
  PRICE local_408;
  StrikePrice local_400;
  PutOrCall local_3a8;
  MaturityMonthYear local_350;
  allocator<char> local_2f1;
  STRING local_2f0;
  Symbol local_2d0;
  int local_274;
  undefined1 local_270 [4];
  int i;
  NoRelatedSym group;
  allocator<char> local_1e1;
  STRING local_1e0;
  QuoteReqID local_1c0;
  undefined1 local_168 [8];
  QuoteRequest message;
  int count_local;
  
  message.super_Message._340_4_ = count + -1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"1",&local_1e1);
  FIX::QuoteReqID::QuoteReqID(&local_1c0,&local_1e0);
  FIX42::QuoteRequest::QuoteRequest((QuoteRequest *)local_168,&local_1c0);
  FIX::QuoteReqID::~QuoteReqID(&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  FIX42::QuoteRequest::NoRelatedSym::NoRelatedSym((NoRelatedSym *)local_270);
  for (local_274 = 1; local_274 < 0xb; local_274 = local_274 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"IBM",&local_2f1);
    FIX::Symbol::Symbol(&local_2d0,&local_2f0);
    FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)local_270,&local_2d0);
    FIX::Symbol::~Symbol(&local_2d0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator(&local_2f1);
    FIX::MaturityMonthYear::MaturityMonthYear(&local_350);
    FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)local_270,&local_350);
    FIX::MaturityMonthYear::~MaturityMonthYear(&local_350);
    FIX::PutOrCall::PutOrCall(&local_3a8,0);
    FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)local_270,&local_3a8);
    FIX::PutOrCall::~PutOrCall(&local_3a8);
    local_408 = 120.0;
    FIX::StrikePrice::StrikePrice(&local_400,&local_408);
    FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)local_270,&local_400);
    FIX::StrikePrice::~StrikePrice(&local_400);
    FIX::Side::Side(&local_460,"11FIX.4.2");
    FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)local_270,&local_460);
    FIX::Side::~Side(&local_460);
    local_4c0 = 100.0;
    FIX::OrderQty::OrderQty(&local_4b8,&local_4c0);
    FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)local_270,&local_4b8);
    FIX::OrderQty::~OrderQty(&local_4b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_538,"USD",&local_539);
    FIX::Currency::Currency(&local_518,&local_538);
    FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)local_270,&local_518);
    FIX::Currency::~Currency(&local_518);
    std::__cxx11::string::~string((string *)&local_538);
    std::allocator<char>::~allocator(&local_539);
    FIX::OrdType::OrdType((OrdType *)&start,"1FIX.4.2");
    FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)local_270,(OrdType *)&start);
    FIX::OrdType::~OrdType((OrdType *)&start);
    FIX::Message::addGroup((Message *)local_168,(Group *)local_270);
  }
  FIX::FieldMap::clear();
  lVar2 = GetTickCount();
  for (quoteReqID.super_StringField.super_FieldBase.m_metrics.m_checksum = 0;
      quoteReqID.super_StringField.super_FieldBase.m_metrics.m_checksum <=
      (int)message.super_Message._340_4_;
      quoteReqID.super_StringField.super_FieldBase.m_metrics.m_checksum =
           quoteReqID.super_StringField.super_FieldBase.m_metrics.m_checksum + 1) {
    FIX::QuoteReqID::QuoteReqID((QuoteReqID *)&symbol.super_StringField.super_FieldBase.m_metrics);
    FIX::Symbol::Symbol((Symbol *)&maturityMonthYear.super_MonthYearField.super_FieldBase.m_metrics)
    ;
    FIX::MaturityMonthYear::MaturityMonthYear
              ((MaturityMonthYear *)&putOrCall.super_IntField.super_FieldBase.m_metrics);
    FIX::PutOrCall::PutOrCall((PutOrCall *)&strikePrice.super_PriceField.super_FieldBase.m_metrics);
    FIX::StrikePrice::StrikePrice((StrikePrice *)&side.super_CharField.super_FieldBase.m_metrics);
    FIX::Side::Side((Side *)&orderQty.super_QtyField.super_FieldBase.m_metrics);
    FIX::OrderQty::OrderQty((OrderQty *)&currency.super_CurrencyField.super_FieldBase.m_metrics);
    FIX::Currency::Currency((Currency *)&ordType.super_CharField.super_FieldBase.m_metrics);
    FIX::OrdType::OrdType((OrdType *)&noRelatedSym.super_NumInGroupField.super_FieldBase.m_metrics);
    FIX::NoRelatedSym::NoRelatedSym((NoRelatedSym *)&k);
    FIX42::QuoteRequest::get((QuoteRequest *)local_168,(NoRelatedSym *)&k);
    iVar1 = FIX::IntField::operator_cast_to_int((IntField *)&k);
    for (local_920 = 1; (int)local_920 <= iVar1; local_920 = local_920 + 1) {
      FIX::Message::getGroup((Message *)local_168,local_920,(Group *)local_270);
      FIX42::QuoteRequest::NoRelatedSym::get
                ((NoRelatedSym *)local_270,
                 (Symbol *)&maturityMonthYear.super_MonthYearField.super_FieldBase.m_metrics);
      FIX42::QuoteRequest::NoRelatedSym::get
                ((NoRelatedSym *)local_270,
                 (MaturityMonthYear *)&putOrCall.super_IntField.super_FieldBase.m_metrics);
      FIX42::QuoteRequest::NoRelatedSym::get
                ((NoRelatedSym *)local_270,
                 (PutOrCall *)&strikePrice.super_PriceField.super_FieldBase.m_metrics);
      FIX42::QuoteRequest::NoRelatedSym::get
                ((NoRelatedSym *)local_270,
                 (StrikePrice *)&side.super_CharField.super_FieldBase.m_metrics);
      FIX42::QuoteRequest::NoRelatedSym::get
                ((NoRelatedSym *)local_270,
                 (Side *)&orderQty.super_QtyField.super_FieldBase.m_metrics);
      FIX42::QuoteRequest::NoRelatedSym::get
                ((NoRelatedSym *)local_270,
                 (OrderQty *)&currency.super_CurrencyField.super_FieldBase.m_metrics);
      FIX42::QuoteRequest::NoRelatedSym::get
                ((NoRelatedSym *)local_270,
                 (Currency *)&ordType.super_CharField.super_FieldBase.m_metrics);
      FIX42::QuoteRequest::NoRelatedSym::get
                ((NoRelatedSym *)local_270,
                 (OrdType *)&noRelatedSym.super_NumInGroupField.super_FieldBase.m_metrics);
      FIX::StringField::getValue_abi_cxx11_
                ((StringField *)&putOrCall.super_IntField.super_FieldBase.m_metrics);
      FIX::IntField::getValue((IntField *)&strikePrice.super_PriceField.super_FieldBase.m_metrics);
      FIX::DoubleField::getValue((DoubleField *)&side.super_CharField.super_FieldBase.m_metrics);
      FIX::CharField::getValue((CharField *)&orderQty.super_QtyField.super_FieldBase.m_metrics);
      FIX::DoubleField::getValue
                ((DoubleField *)&currency.super_CurrencyField.super_FieldBase.m_metrics);
      FIX::StringField::getValue_abi_cxx11_
                ((StringField *)&ordType.super_CharField.super_FieldBase.m_metrics);
      FIX::CharField::getValue
                ((CharField *)&noRelatedSym.super_NumInGroupField.super_FieldBase.m_metrics);
    }
    FIX::NoRelatedSym::~NoRelatedSym((NoRelatedSym *)&k);
    FIX::OrdType::~OrdType((OrdType *)&noRelatedSym.super_NumInGroupField.super_FieldBase.m_metrics)
    ;
    FIX::Currency::~Currency((Currency *)&ordType.super_CharField.super_FieldBase.m_metrics);
    FIX::OrderQty::~OrderQty((OrderQty *)&currency.super_CurrencyField.super_FieldBase.m_metrics);
    FIX::Side::~Side((Side *)&orderQty.super_QtyField.super_FieldBase.m_metrics);
    FIX::StrikePrice::~StrikePrice((StrikePrice *)&side.super_CharField.super_FieldBase.m_metrics);
    FIX::PutOrCall::~PutOrCall((PutOrCall *)&strikePrice.super_PriceField.super_FieldBase.m_metrics)
    ;
    FIX::MaturityMonthYear::~MaturityMonthYear
              ((MaturityMonthYear *)&putOrCall.super_IntField.super_FieldBase.m_metrics);
    FIX::Symbol::~Symbol
              ((Symbol *)&maturityMonthYear.super_MonthYearField.super_FieldBase.m_metrics);
    FIX::QuoteReqID::~QuoteReqID((QuoteReqID *)&symbol.super_StringField.super_FieldBase.m_metrics);
  }
  lVar3 = GetTickCount();
  FIX42::QuoteRequest::NoRelatedSym::~NoRelatedSym((NoRelatedSym *)local_270);
  FIX42::QuoteRequest::~QuoteRequest((QuoteRequest *)local_168);
  return lVar3 - lVar2;
}

Assistant:

long testReadFromQuoteRequest(int count) {
  count = count - 1;

  FIX42::QuoteRequest message(FIX::QuoteReqID("1"));
  FIX42::QuoteRequest::NoRelatedSym group;

  for (int i = 1; i <= 10; ++i) {
    group.set(FIX::Symbol("IBM"));
    group.set(FIX::MaturityMonthYear());
    group.set(FIX::PutOrCall(FIX::PutOrCall_PUT));
    group.set(FIX::StrikePrice(120));
    group.set(FIX::Side(FIX::Side_BUY));
    group.set(FIX::OrderQty(100));
    group.set(FIX::Currency("USD"));
    group.set(FIX::OrdType(FIX::OrdType_MARKET));
    message.addGroup(group);
  }
  group.clear();

  long start = GetTickCount();
  for (int j = 0; j <= count; ++j) {
    FIX::QuoteReqID quoteReqID;
    FIX::Symbol symbol;
    FIX::MaturityMonthYear maturityMonthYear;
    FIX::PutOrCall putOrCall;
    FIX::StrikePrice strikePrice;
    FIX::Side side;
    FIX::OrderQty orderQty;
    FIX::Currency currency;
    FIX::OrdType ordType;

    FIX::NoRelatedSym noRelatedSym;
    message.get(noRelatedSym);
    int end = noRelatedSym;
    for (int k = 1; k <= end; ++k) {
      message.getGroup(k, group);
      group.get(symbol);
      group.get(maturityMonthYear);
      group.get(putOrCall);
      group.get(strikePrice);
      group.get(side);
      group.get(orderQty);
      group.get(currency);
      group.get(ordType);
      maturityMonthYear.getValue();
      putOrCall.getValue();
      strikePrice.getValue();
      side.getValue();
      orderQty.getValue();
      currency.getValue();
      ordType.getValue();
    }
  }

  return GetTickCount() - start;
}